

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::fixColumn(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int j,bool correctIdx)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  pointer pnVar5;
  Real eps;
  bool bVar6;
  bool bVar7;
  type_conflict5 tVar8;
  long lVar9;
  double *pdVar10;
  FixVariablePS *this_00;
  undefined7 in_register_00000009;
  long lVar11;
  long lVar12;
  Item *pIVar13;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_598 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_590;
  uint local_588 [3];
  undefined3 uStack_57b;
  uint local_578;
  undefined3 uStack_573;
  int local_570;
  bool local_56c;
  undefined8 local_568;
  Item *local_558;
  undefined4 local_550;
  int local_54c;
  cpp_dec_float<50U,_int,_void> local_548;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_510;
  long local_508;
  long local_500;
  Tolerances *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f0;
  uint local_4e8 [2];
  uint auStack_4e0 [2];
  uint local_4d8 [2];
  int local_4d0;
  bool local_4cc;
  fpclass_type local_4c8;
  int32_t local_4c4;
  Tolerances *local_4b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4b0;
  uint local_4a8 [2];
  uint auStack_4a0 [2];
  uint local_498 [2];
  int local_490;
  bool local_48c;
  fpclass_type local_488;
  int32_t iStack_484;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_480;
  long local_478;
  long local_470;
  cpp_dec_float<50U,_int,_void> local_468;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_428;
  cpp_dec_float<50U,_int,_void> local_418;
  cpp_dec_float<50U,_int,_void> local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  Tolerances *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_350;
  uint local_348 [2];
  uint auStack_340 [2];
  uint local_338 [2];
  int local_330;
  bool local_32c;
  fpclass_type local_328;
  int32_t local_324;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  Tolerances *local_2d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2d0;
  uint local_2c8 [2];
  uint auStack_2c0 [2];
  uint local_2b8 [2];
  int local_2b0;
  bool local_2ac;
  fpclass_type local_2a8;
  int32_t iStack_2a4;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  int local_270;
  undefined1 local_26c;
  undefined8 local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  Tolerances *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_210;
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  int local_1f0;
  bool local_1ec;
  fpclass_type local_1e8;
  int32_t iStack_1e4;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  int local_1b0;
  undefined1 local_1ac;
  undefined8 local_1a8;
  cpp_dec_float<50U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  Tolerances *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  int local_f0;
  bool local_ec;
  fpclass_type local_e8;
  int32_t local_e4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_550 = (undefined4)CONCAT71(in_register_00000009,correctIdx);
  lVar12 = (long)j;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_478 = lVar12 * 0x38;
  local_4d8 = *(uint (*) [2])(pnVar5[lVar12].m_backend.data._M_elems + 8);
  local_4f8 = *(Tolerances **)&pnVar5[lVar12].m_backend.data;
  p_Stack_4f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (pnVar5[lVar12].m_backend.data._M_elems + 2);
  puVar1 = pnVar5[lVar12].m_backend.data._M_elems + 4;
  local_4e8 = *(uint (*) [2])puVar1;
  auStack_4e0 = *(uint (*) [2])(puVar1 + 2);
  iVar2 = pnVar5[lVar12].m_backend.exp;
  bVar7 = pnVar5[lVar12].m_backend.neg;
  fVar3 = pnVar5[lVar12].m_backend.fpclass;
  iVar4 = pnVar5[lVar12].m_backend.prec_elem;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_468.data._M_elems._32_8_ = *(undefined8 *)(pnVar5[lVar12].m_backend.data._M_elems + 8);
  local_468.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar12].m_backend.data;
  local_468.data._M_elems._8_8_ = *(undefined8 *)(pnVar5[lVar12].m_backend.data._M_elems + 2);
  puVar1 = pnVar5[lVar12].m_backend.data._M_elems + 4;
  local_468.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_468.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_468.exp = pnVar5[lVar12].m_backend.exp;
  local_468.neg = pnVar5[lVar12].m_backend.neg;
  local_468.fpclass = pnVar5[lVar12].m_backend.fpclass;
  local_468.prec_elem = pnVar5[lVar12].m_backend.prec_elem;
  local_558 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar12].idx;
  iStack_484 = iVar4;
  local_488 = fVar3;
  local_480 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
  local_54c = j;
  local_4d0 = iVar2;
  local_4cc = bVar7;
  local_4c8 = fVar3;
  local_4c4 = iVar4;
  local_4b8 = local_4f8;
  p_Stack_4b0 = p_Stack_4f0;
  local_4a8 = local_4e8;
  auStack_4a0 = auStack_4e0;
  local_498 = local_4d8;
  local_490 = iVar2;
  local_48c = bVar7;
  local_398.m_backend.data._M_elems._0_8_ = local_468.data._M_elems._0_8_;
  local_398.m_backend.data._M_elems._8_8_ = local_468.data._M_elems._8_8_;
  local_398.m_backend.data._M_elems._16_8_ = local_468.data._M_elems._16_8_;
  local_398.m_backend.data._M_elems._24_8_ = local_468.data._M_elems._24_8_;
  local_398.m_backend.data._M_elems._32_8_ = local_468.data._M_elems._32_8_;
  local_398.m_backend.exp = local_468.exp;
  local_398.m_backend.neg = local_468.neg;
  local_398.m_backend.fpclass = local_468.fpclass;
  local_398.m_backend.prec_elem = local_468.prec_elem;
  local_358 = local_4f8;
  p_Stack_350 = p_Stack_4f0;
  local_348 = local_4e8;
  auStack_340 = auStack_4e0;
  local_338 = local_4d8;
  local_330 = iVar2;
  local_32c = bVar7;
  local_328 = fVar3;
  local_324 = iVar4;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_598,local_480);
  eps = Tolerances::epsilon((Tolerances *)local_598);
  bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_358,&local_398,eps);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_590);
  local_f0 = iVar2;
  local_ec = bVar7;
  local_e8 = fVar3;
  local_e4 = iVar4;
  if (bVar6) {
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 10;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems._24_5_ = 0;
    local_198.data._M_elems[7]._1_3_ = 0;
    local_198.data._M_elems._32_5_ = 0;
    local_198._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_198,&local_468,(cpp_dec_float<50U,_int,_void> *)&local_4f8);
    local_548.data._M_elems[0] = 0;
    local_548.data._M_elems[1] = 0x40000000;
    local_568._0_4_ = cpp_dec_float_finite;
    local_568._4_4_ = 10;
    local_598 = (undefined1  [8])0x0;
    _Stack_590._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_588[0] = 0;
    local_588[1] = 0;
    stack0xfffffffffffffa80 = 0;
    uStack_57b = 0;
    _local_578 = 0;
    uStack_573 = 0;
    local_570 = 0;
    local_56c = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              ((cpp_dec_float<50U,_int,_void> *)local_598,&local_198,(double *)&local_548);
    local_498[1]._1_3_ = uStack_573;
    local_498._0_5_ = _local_578;
    auStack_4a0[1]._1_3_ = uStack_57b;
    auStack_4a0._0_5_ = stack0xfffffffffffffa80;
    local_4a8[0] = local_588[0];
    local_4a8[1] = local_588[1];
    local_4b8 = (Tolerances *)local_598;
    p_Stack_4b0 = _Stack_590._M_pi;
    local_490 = local_570;
    local_48c = local_56c;
    local_488 = (fpclass_type)local_568;
    iStack_484 = local_568._4_4_;
    local_f0 = local_4d0;
    local_ec = local_4cc;
    local_e8 = local_4c8;
    local_e4 = local_4c4;
  }
  local_f8[0] = local_4d8[0];
  local_f8[1] = local_4d8[1];
  local_108[0] = local_4e8[0];
  local_108[1] = local_4e8[1];
  auStack_100[0] = auStack_4e0[0];
  auStack_100[1] = auStack_4e0[1];
  local_118 = local_4f8;
  p_Stack_110 = p_Stack_4f0;
  epsZero(&local_68,this);
  bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_118,&local_68);
  if (bVar7) {
    lVar12 = 0;
    lVar11 = 0;
    pIVar13 = local_558;
    local_510 = lp;
    while( true ) {
      if ((pIVar13->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused <= lVar11) break;
      lVar9 = (long)*(int *)((long)(&((pIVar13->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val + 1) + lVar12);
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_508 = lVar9;
      local_470 = lVar11;
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_598,*pdVar10,(type *)0x0);
      tVar8 = boost::multiprecision::operator<
                        (pnVar5 + lVar9,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_598);
      local_500 = lVar12;
      if (tVar8) {
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_598 = (undefined1  [8])0x0;
        _Stack_590._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_588[0] = 0;
        local_588[1] = 0;
        stack0xfffffffffffffa80 = 0;
        uStack_57b = 0;
        _local_578 = 0;
        uStack_573 = 0;
        local_570 = 0;
        local_56c = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_598,
                   (cpp_dec_float<50U,_int,_void> *)&local_4b8,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((local_558->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem)->val).m_backend.data._M_elems + lVar12));
        pnVar5 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1b8 = *(undefined8 *)(pnVar5[lVar9].m_backend.data._M_elems + 8);
        local_1d8 = *(undefined8 *)&pnVar5[lVar9].m_backend.data;
        uStack_1d0 = *(undefined8 *)(pnVar5[lVar9].m_backend.data._M_elems + 2);
        puVar1 = pnVar5[lVar9].m_backend.data._M_elems + 4;
        local_1c8 = *(undefined8 *)puVar1;
        uStack_1c0 = *(undefined8 *)(puVar1 + 2);
        local_1b0 = pnVar5[lVar9].m_backend.exp;
        local_1ac = pnVar5[lVar9].m_backend.neg;
        local_1a8._0_4_ = pnVar5[lVar9].m_backend.fpclass;
        local_1a8._4_4_ = pnVar5[lVar9].m_backend.prec_elem;
        auStack_200[1]._1_3_ = uStack_57b;
        auStack_200._0_5_ = stack0xfffffffffffffa80;
        local_218 = (Tolerances *)local_598;
        p_Stack_210 = _Stack_590._M_pi;
        local_208[0] = local_588[0];
        local_208[1] = local_588[1];
        local_1f8[1]._1_3_ = uStack_573;
        local_1f8._0_5_ = _local_578;
        local_1f0 = local_570;
        local_1ec = local_56c;
        local_1e8 = (fpclass_type)local_568;
        iStack_1e4 = local_568._4_4_;
        maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_198,(soplex *)&local_1d8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_218,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)CONCAT31((int3)((uint)local_1b0 >> 8),local_1ac));
        local_548.data._M_elems[0] = 0;
        local_548.data._M_elems[1] = 0x3ff00000;
        tVar8 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198,(double *)&local_548);
        if (tVar8) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_198,1.0);
        }
        local_3d8.fpclass = cpp_dec_float_finite;
        local_3d8.prec_elem = 10;
        local_3d8.data._M_elems[0] = 0;
        local_3d8.data._M_elems[1] = 0;
        local_3d8.data._M_elems[2] = 0;
        local_3d8.data._M_elems[3] = 0;
        local_3d8.data._M_elems[4] = 0;
        local_3d8.data._M_elems[5] = 0;
        local_3d8.data._M_elems._24_5_ = 0;
        local_3d8.data._M_elems[7]._1_3_ = 0;
        local_3d8.data._M_elems._32_5_ = 0;
        local_3d8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_3d8,
                   &(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend,&local_198);
        local_418.fpclass = cpp_dec_float_finite;
        local_418.prec_elem = 10;
        local_418.data._M_elems[0] = 0;
        local_418.data._M_elems[1] = 0;
        local_418.data._M_elems[2] = 0;
        local_418.data._M_elems[3] = 0;
        local_418.data._M_elems[4] = 0;
        local_418.data._M_elems[5] = 0;
        local_418.data._M_elems._24_5_ = 0;
        local_418.data._M_elems[7]._1_3_ = 0;
        local_418.data._M_elems._32_5_ = 0;
        local_418._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_418,(cpp_dec_float<50U,_int,_void> *)local_598,&local_198);
        local_548.fpclass = cpp_dec_float_finite;
        local_548.prec_elem = 10;
        local_548.data._M_elems[0] = 0;
        local_548.data._M_elems[1] = 0;
        local_548.data._M_elems[2] = 0;
        local_548.data._M_elems[3] = 0;
        local_548.data._M_elems[4] = 0;
        local_548.data._M_elems[5] = 0;
        local_548.data._M_elems._24_5_ = 0;
        local_548.data._M_elems[7]._1_3_ = 0;
        local_548.data._M_elems._32_5_ = 0;
        local_548.data._M_elems[9]._1_3_ = 0;
        local_548.exp = 0;
        local_548.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_548,&local_3d8,&local_418);
        local_258.m_backend.data._M_elems[7]._1_3_ = local_548.data._M_elems[7]._1_3_;
        local_258.m_backend.data._M_elems._24_5_ = local_548.data._M_elems._24_5_;
        local_258.m_backend.data._M_elems[0] = local_548.data._M_elems[0];
        local_258.m_backend.data._M_elems[1] = local_548.data._M_elems[1];
        local_258.m_backend.data._M_elems[2] = local_548.data._M_elems[2];
        local_258.m_backend.data._M_elems[3] = local_548.data._M_elems[3];
        local_258.m_backend.data._M_elems[4] = local_548.data._M_elems[4];
        local_258.m_backend.data._M_elems[5] = local_548.data._M_elems[5];
        local_258.m_backend.data._M_elems[9]._1_3_ = local_548.data._M_elems[9]._1_3_;
        local_258.m_backend.data._M_elems._32_5_ = local_548.data._M_elems._32_5_;
        local_258.m_backend.exp = local_548.exp;
        local_258.m_backend.neg = local_548.neg;
        local_258.m_backend.fpclass = local_548.fpclass;
        local_258.m_backend.prec_elem = local_548.prec_elem;
        epsZero(&local_a0,this);
        bVar7 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_258,&local_a0);
        if (bVar7) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_548,0.0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_548,&local_198);
        }
        lp = local_510;
        (*(local_510->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(local_510,local_508,&local_548,0);
      }
      lVar12 = local_500;
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_598,-*pdVar10,(type *)0x0);
      tVar8 = boost::multiprecision::operator>
                        (pnVar5 + lVar9,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_598);
      pIVar13 = local_558;
      if (tVar8) {
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_598 = (undefined1  [8])0x0;
        _Stack_590._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_588[0] = 0;
        local_588[1] = 0;
        stack0xfffffffffffffa80 = 0;
        uStack_57b = 0;
        _local_578 = 0;
        uStack_573 = 0;
        local_570 = 0;
        local_56c = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_598,
                   (cpp_dec_float<50U,_int,_void> *)&local_4b8,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((local_558->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem)->val).m_backend.data._M_elems + lVar12));
        pnVar5 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_278 = *(undefined8 *)(pnVar5[lVar9].m_backend.data._M_elems + 8);
        local_298 = *(undefined8 *)&pnVar5[lVar9].m_backend.data;
        uStack_290 = *(undefined8 *)(pnVar5[lVar9].m_backend.data._M_elems + 2);
        puVar1 = pnVar5[lVar9].m_backend.data._M_elems + 4;
        local_288 = *(undefined8 *)puVar1;
        uStack_280 = *(undefined8 *)(puVar1 + 2);
        local_270 = pnVar5[lVar9].m_backend.exp;
        local_26c = pnVar5[lVar9].m_backend.neg;
        local_268._0_4_ = pnVar5[lVar9].m_backend.fpclass;
        local_268._4_4_ = pnVar5[lVar9].m_backend.prec_elem;
        auStack_2c0[1]._1_3_ = uStack_57b;
        auStack_2c0._0_5_ = stack0xfffffffffffffa80;
        local_2d8 = (Tolerances *)local_598;
        p_Stack_2d0 = _Stack_590._M_pi;
        local_2c8[0] = local_588[0];
        local_2c8[1] = local_588[1];
        local_2b8[1]._1_3_ = uStack_573;
        local_2b8._0_5_ = _local_578;
        local_2b0 = local_570;
        local_2ac = local_56c;
        local_2a8 = (fpclass_type)local_568;
        iStack_2a4 = local_568._4_4_;
        maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_198,(soplex *)&local_298,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_2d8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)CONCAT31((int3)((uint)local_270 >> 8),local_26c));
        local_548.data._M_elems[0] = 0;
        local_548.data._M_elems[1] = 0x3ff00000;
        tVar8 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198,(double *)&local_548);
        if (tVar8) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_198,1.0);
        }
        local_3d8.fpclass = cpp_dec_float_finite;
        local_3d8.prec_elem = 10;
        local_3d8.data._M_elems[0] = 0;
        local_3d8.data._M_elems[1] = 0;
        local_3d8.data._M_elems[2] = 0;
        local_3d8.data._M_elems[3] = 0;
        local_3d8.data._M_elems[4] = 0;
        local_3d8.data._M_elems[5] = 0;
        local_3d8.data._M_elems._24_5_ = 0;
        local_3d8.data._M_elems[7]._1_3_ = 0;
        local_3d8.data._M_elems._32_5_ = 0;
        local_3d8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_3d8,
                   &(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend,&local_198);
        local_418.fpclass = cpp_dec_float_finite;
        local_418.prec_elem = 10;
        local_418.data._M_elems[0] = 0;
        local_418.data._M_elems[1] = 0;
        local_418.data._M_elems[2] = 0;
        local_418.data._M_elems[3] = 0;
        local_418.data._M_elems[4] = 0;
        local_418.data._M_elems[5] = 0;
        local_418.data._M_elems._24_5_ = 0;
        local_418.data._M_elems[7]._1_3_ = 0;
        local_418.data._M_elems._32_5_ = 0;
        local_418._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_418,(cpp_dec_float<50U,_int,_void> *)local_598,&local_198);
        local_548.fpclass = cpp_dec_float_finite;
        local_548.prec_elem = 10;
        local_548.data._M_elems[0] = 0;
        local_548.data._M_elems[1] = 0;
        local_548.data._M_elems[2] = 0;
        local_548.data._M_elems[3] = 0;
        local_548.data._M_elems[4] = 0;
        local_548.data._M_elems[5] = 0;
        local_548.data._M_elems._24_5_ = 0;
        local_548.data._M_elems[7]._1_3_ = 0;
        local_548.data._M_elems._32_5_ = 0;
        local_548.data._M_elems[9]._1_3_ = 0;
        local_548.exp = 0;
        local_548.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_548,&local_3d8,&local_418);
        local_318.m_backend.data._M_elems[7]._1_3_ = local_548.data._M_elems[7]._1_3_;
        local_318.m_backend.data._M_elems._24_5_ = local_548.data._M_elems._24_5_;
        local_318.m_backend.data._M_elems[0] = local_548.data._M_elems[0];
        local_318.m_backend.data._M_elems[1] = local_548.data._M_elems[1];
        local_318.m_backend.data._M_elems[2] = local_548.data._M_elems[2];
        local_318.m_backend.data._M_elems[3] = local_548.data._M_elems[3];
        local_318.m_backend.data._M_elems[4] = local_548.data._M_elems[4];
        local_318.m_backend.data._M_elems[5] = local_548.data._M_elems[5];
        local_318.m_backend.data._M_elems[9]._1_3_ = local_548.data._M_elems[9]._1_3_;
        local_318.m_backend.data._M_elems._32_5_ = local_548.data._M_elems._32_5_;
        local_318.m_backend.exp = local_548.exp;
        local_318.m_backend.neg = local_548.neg;
        local_318.m_backend.fpclass = local_548.fpclass;
        local_318.m_backend.prec_elem = local_548.prec_elem;
        epsZero(&local_d8,this);
        bVar7 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_318,&local_d8);
        if (bVar7) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_548,0.0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_548,&local_198);
        }
        lp = local_510;
        (*(local_510->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(local_510,local_508,&local_548,0);
        lVar12 = local_500;
      }
      lVar11 = local_470 + 1;
      lVar12 = lVar12 + 0x3c;
    }
  }
  this_00 = (FixVariablePS *)operator_new(0x138);
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (uint *)((long)(pnVar5->m_backend).data._M_elems + local_478);
  local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
  local_158.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)(pnVar5->m_backend).data._M_elems + local_478 + 0x10);
  local_158.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_158.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_158.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + local_478 + 0x20);
  local_158.m_backend.exp = *(int *)((long)(&(pnVar5->m_backend).data + 1) + local_478);
  local_158.m_backend.neg = *(bool *)((long)(&(pnVar5->m_backend).data + 1) + local_478 + 4U);
  local_158.m_backend._48_8_ =
       *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + local_478 + 8U);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_428,local_480);
  FixVariablePS::FixVariablePS
            (this_00,lp,this,local_54c,&local_158,(shared_ptr<soplex::Tolerances> *)&local_428,
             SUB41(local_550,0));
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)local_598,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_428._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,(value_type *)local_598);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_590);
  return;
}

Assistant:

void SPxMainSM<R>::fixColumn(SPxLPBase<R>& lp, int j, bool correctIdx)
{

   assert(EQrel(lp.lower(j), lp.upper(j), feastol()));

   R lo            = lp.lower(j);
   R up            = lp.upper(j);
   const SVectorBase<R>& col = lp.colVector(j);
   R mid           = lo;

   // use the center value between slightly different bounds to improve numerics
   if(NE(lo, up, this->tolerances()->epsilon()))
      mid = (up + lo) / 2.0;

   assert(lo < R(infinity) && lo > R(-infinity));
   assert(up < R(infinity) && up > R(-infinity));

   SPxOut::debug(this, "IMAISM66 fix variable x{}: lower={} upper={} to new value: {}\n", j, lo, up,
                 mid);

   if(isNotZero(lo, this->epsZero()))
   {
      for(int k = 0; k < col.size(); ++k)
      {
         int i = col.index(k);

         if(lp.rhs(i) < R(infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.rhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R rhs = (lp.rhs(i) / scale) - (y / scale);

            if(isZero(rhs, this->epsZero()))
               rhs = 0.0;
            else
               rhs *= scale;

            SPxOut::debug(this, "IMAISM67 row {}: rhs={} ({}) aij={}\n", i, rhs, lp.rhs(i), col.value(k));

            lp.changeRhs(i, rhs);
         }

         if(lp.lhs(i) > R(-infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.lhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R lhs = (lp.lhs(i) / scale) - (y / scale);

            if(isZero(lhs, this->epsZero()))
               lhs = 0.0;
            else
               lhs *= scale;

            SPxOut::debug(this, "IMAISM68 row {}: lhs={} ({}) aij={}\n", i, lhs, lp.lhs(i), col.value(k));

            lp.changeLhs(i, lhs);
         }

         assert(lp.lhs(i) <= lp.rhs(i) + feastol());
      }
   }

   std::shared_ptr<PostStep> ptr(new FixVariablePS(lp, *this, j, lp.lower(j), this->_tolerances,
                                 correctIdx));
   m_hist.append(ptr);
}